

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasFoodWeb_bnd.c
# Opt level: O1

void SetInitialProfiles(N_Vector cc,N_Vector cp,N_Vector id,UserData webdata)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined8 uVar14;
  
  lVar3 = N_VGetArrayPointer();
  lVar4 = N_VGetArrayPointer(cp);
  lVar5 = N_VGetArrayPointer(id);
  lVar2 = webdata->np;
  lVar6 = 0;
  do {
    dVar11 = (double)lVar6 * webdata->dy;
    lVar9 = 0;
    lVar7 = lVar3;
    lVar8 = lVar5;
    do {
      dVar12 = (double)lVar9 * webdata->dx;
      dVar12 = (1.0 - dVar12) * dVar12 * 16.0 * dVar11 * (1.0 - dVar11);
      lVar10 = 0;
      do {
        lVar1 = lVar10 + 1;
        dVar13 = (double)lVar1 * dVar12 * dVar12 + 10.0;
        if (lVar2 <= lVar10) {
          dVar13 = 100000.0;
        }
        uVar14 = 0x3ff0000000000000;
        if (lVar2 <= lVar10) {
          uVar14 = 0;
        }
        *(double *)(lVar7 + lVar10 * 8) = dVar13;
        *(undefined8 *)(lVar8 + lVar10 * 8) = uVar14;
        lVar10 = lVar1;
      } while (lVar1 == 1);
      lVar9 = lVar9 + 1;
      lVar8 = lVar8 + 0x10;
      lVar7 = lVar7 + 0x10;
    } while (lVar9 != 0x14);
    lVar6 = lVar6 + 1;
    lVar5 = lVar5 + 0x140;
    lVar3 = lVar3 + 0x140;
  } while (lVar6 != 0x14);
  Fweb(1.0,cc,cp,webdata);
  lVar4 = lVar4 + lVar2 * 8;
  lVar3 = 0;
  do {
    lVar5 = -0x140;
    do {
      if (lVar2 < 2) {
        memset((void *)(lVar4 + lVar5 + 0x140),0,lVar2 * -8 + 0x10);
      }
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0);
    lVar3 = lVar3 + 1;
    lVar4 = lVar4 + 0x140;
  } while (lVar3 != 0x14);
  return;
}

Assistant:

static void SetInitialProfiles(N_Vector cc, N_Vector cp, N_Vector id,
                               UserData webdata)
{
  sunindextype loc, yloc, is, jx, jy, np;
  sunrealtype xx, yy, xyfactor;
  sunrealtype *ccv, *cpv, *idv;

  ccv = N_VGetArrayPointer(cc);
  cpv = N_VGetArrayPointer(cp);
  idv = N_VGetArrayPointer(id);
  np  = webdata->np;

  /* Loop over grid, load cc values and id values. */
  for (jy = 0; jy < MY; jy++)
  {
    yy   = jy * webdata->dy;
    yloc = NSMX * jy;
    for (jx = 0; jx < MX; jx++)
    {
      xx       = jx * webdata->dx;
      xyfactor = SUN_RCONST(16.0) * xx * (ONE - xx) * yy * (ONE - yy);
      xyfactor *= xyfactor;
      loc = yloc + NUM_SPECIES * jx;

      for (is = 0; is < NUM_SPECIES; is++)
      {
        if (is < np)
        {
          ccv[loc + is] = SUN_RCONST(10.0) + (sunrealtype)(is + 1) * xyfactor;
          idv[loc + is] = ONE;
        }
        else
        {
          ccv[loc + is] = SUN_RCONST(1.0e5);
          idv[loc + is] = ZERO;
        }
      }
    }
  }

  /* Set c' for the prey by calling the function Fweb. */
  Fweb(ZERO, cc, cp, webdata);

  /* Set c' for predators to 0. */
  for (jy = 0; jy < MY; jy++)
  {
    yloc = NSMX * jy;
    for (jx = 0; jx < MX; jx++)
    {
      loc = yloc + NUM_SPECIES * jx;
      for (is = np; is < NUM_SPECIES; is++) { cpv[loc + is] = ZERO; }
    }
  }
}